

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O0

void unpackFile(string *cpioArchivePath,string *filename)

{
  bool bVar1;
  __type _Var2;
  ssize_t sVar3;
  CpioException *pCVar4;
  size_t sVar5;
  pointer pcVar6;
  allocator<char> local_e9;
  string local_e8;
  long local_c8;
  size_t realBytesToSkip;
  size_t bytesToSkip;
  undefined1 local_b0 [8];
  string filenameFromArchive;
  __array cFilename;
  size_t realFilenameSize;
  size_t filenameSize;
  string local_70;
  DescriptorWrapper local_40;
  undefined1 local_3a [2];
  DescriptorWrapper fd;
  header_old_cpio header;
  ssize_t sz;
  string *filename_local;
  string *cpioArchivePath_local;
  
  DescriptorWrapper::openFile(&local_40,cpioArchivePath,0);
  do {
    sVar3 = DescriptorWrapper::readTo(&local_40,local_3a,0x1a);
    if (sVar3 == 0) {
      filenameSize._6_1_ = 1;
      pCVar4 = (CpioException *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unexpected EOF",(allocator<char> *)((long)&filenameSize + 7));
      CpioException::CpioException(pCVar4,InvalidInputArchive,&local_70);
      filenameSize._6_1_ = 0;
      __cxa_throw(pCVar4,&CpioException::typeinfo,CpioException::~CpioException);
    }
    bVar1 = isHeaderLittleEndian((header_old_cpio *)local_3a);
    if (bVar1) {
      switchEndianness((header_old_cpio *)local_3a);
    }
    sVar5 = getFilenameSizeFromBigEndianHeader((header_old_cpio *)local_3a);
    std::make_unique<char[]>((size_t)((long)&filenameFromArchive.field_2 + 8));
    pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        ((long)&filenameFromArchive.field_2 + 8));
    DescriptorWrapper::readTo(&local_40,pcVar6,sVar5 + ((uint)sVar5 & 1));
    pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        ((long)&filenameFromArchive.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,pcVar6,(allocator<char> *)((long)&bytesToSkip + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&bytesToSkip + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"TRAILER!!!");
    if (bVar1) {
      bytesToSkip._0_4_ = 2;
    }
    else {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,filename);
      if (_Var2) {
        unpackFileInternal((header_old_cpio *)local_3a,&local_40,(string *)local_b0);
        bytesToSkip._0_4_ = 1;
      }
      else {
        realBytesToSkip = getFileSizeFromBigEndianHeader((header_old_cpio *)local_3a);
        local_c8 = realBytesToSkip + ((uint)realBytesToSkip & 1);
        DescriptorWrapper::seek(&local_40,local_c8,1);
        bytesToSkip._0_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_b0);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)
               ((long)&filenameFromArchive.field_2 + 8));
  } while ((int)bytesToSkip == 0);
  if ((int)bytesToSkip == 2) {
    pCVar4 = (CpioException *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Couldn\'t find specified file in archive",&local_e9);
    CpioException::CpioException(pCVar4,FileNotFoundInArchive,&local_e8);
    __cxa_throw(pCVar4,&CpioException::typeinfo,CpioException::~CpioException);
  }
  DescriptorWrapper::~DescriptorWrapper(&local_40);
  return;
}

Assistant:

void unpackFile(const string& cpioArchivePath, const string& filename) 
{
	ssize_t sz = -1;
	header_old_cpio header;


	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);

		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filenameFromArchive(cFilename.get());
		if (filenameFromArchive == "TRAILER!!!") {
			break;
		}
		else if (filenameFromArchive == filename) {
			unpackFileInternal(header, fd, filenameFromArchive);
			return;
		}

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	throw CpioException(CpioException::FileNotFoundInArchive, "Couldn't find specified file in archive");
	return;
}